

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::NetworkHttpClient::openWebSocket
          (NetworkHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  HttpClient *pHVar1;
  int __flags;
  void *__child_stack;
  char *pcVar2;
  __fn *in_R8;
  void *__arg;
  Options in_R9W;
  size_t sVar3;
  StringPtr url_00;
  StringPtr value;
  String path;
  HttpHeaders headersCopy;
  Url parsed;
  String local_178;
  HttpHeaders local_160;
  Url local_100;
  
  __arg = (void *)0x100;
  url_00.content.size_ = 1;
  url_00.content.ptr = (char *)headers;
  __flags = 1;
  Url::parse(&local_100,(Url *)url.content.size_,url_00,0x100,in_R9W);
  Url::toString(&local_178,&local_100,HTTP_REQUEST);
  HttpHeaders::clone(&local_160,in_R8,__child_stack,__flags,__arg);
  if (local_100.host.content.size_ == 0) {
    local_100.host.content.ptr = "";
  }
  sVar3 = local_100.host.content.size_ + (local_100.host.content.size_ == 0);
  value.content.size_ = sVar3;
  value.content.ptr = local_100.host.content.ptr;
  requireValidHeaderValue(value);
  local_160.indexedHeaders.ptr[0xb].content.ptr = local_100.host.content.ptr;
  local_160.indexedHeaders.ptr[0xb].content.size_ = sVar3;
  pHVar1 = getClient((NetworkHttpClient *)url.content.ptr,&local_100);
  pcVar2 = local_178.content.ptr;
  if (local_178.content.size_ == 0) {
    pcVar2 = "";
  }
  (*pHVar1->_vptr_HttpClient[1])
            (this,pHVar1,pcVar2,local_178.content.size_ + (local_178.content.size_ == 0),&local_160)
  ;
  HttpHeaders::~HttpHeaders(&local_160);
  sVar3 = local_178.content.size_;
  pcVar2 = local_178.content.ptr;
  if (local_178.content.ptr != (char *)0x0) {
    local_178.content.ptr = (char *)0x0;
    local_178.content.size_ = 0;
    (**(local_178.content.disposer)->_vptr_ArrayDisposer)
              (local_178.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  Url::~Url(&local_100);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    // We need to parse the proxy-style URL to convert it to origin-form.
    // https://www.rfc-editor.org/rfc/rfc9112.html#name-origin-form
    // Use URL parsing options that avoid unnecessary rewrites.
    Url::Options urlOptions;
    urlOptions.allowEmpty = true;
    urlOptions.percentDecode = false;

    auto parsed = Url::parse(url, Url::HTTP_PROXY_REQUEST, urlOptions);
    auto path = parsed.toString(Url::HTTP_REQUEST);
    auto headersCopy = headers.clone();
    headersCopy.set(HttpHeaderId::HOST, parsed.host);
    return getClient(parsed).openWebSocket(path, headersCopy);
  }